

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deduce_scope.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_9 [8];
  i injector;
  
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<interface>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_interface,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<implementation,_0,_0>(this);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ();
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<example,_0>(local_9);
  return 0;
}

Assistant:

int main() {
  /*<<create injector with deduced `interface`>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<interface>().to<implementation>()  // => di::bind<interface>().to<implementation>().in(di::deduce)
  );
  // clang-format on

  /*<<create `example`>>*/
  injector.create<example>();
}